

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_precompile_own_deviation(lysc_ctx *ctx,lysp_deviation *dev_p,lysp_module *pmod)

{
  char **ppcVar1;
  char *pcVar2;
  ly_bool lVar3;
  lys_module *plVar4;
  undefined8 *local_68;
  char *p___1;
  char *p__;
  uint32_t i;
  lysp_module **new_dev_pmod;
  lys_module *mod;
  lysp_deviation **new_dev;
  lysc_nodeid *nodeid;
  lysc_deviation *dev;
  lysp_module *plStack_20;
  LY_ERR ret;
  lysp_module *pmod_local;
  lysp_deviation *dev_p_local;
  lysc_ctx *ctx_local;
  
  dev._4_4_ = 0;
  nodeid = (lysc_nodeid *)0x0;
  new_dev = (lysp_deviation **)0x0;
  plStack_20 = pmod;
  pmod_local = (lysp_module *)dev_p;
  dev_p_local = (lysp_deviation *)ctx;
  dev._4_4_ = lys_precompile_nodeid(ctx->ctx,dev_p->nodeid,(lysc_nodeid **)&new_dev);
  if (dev._4_4_ == LY_SUCCESS) {
    plVar4 = lys_schema_node_get_module((ly_ctx *)dev_p_local->nodeid,new_dev[1]->nodeid,plStack_20)
    ;
    if (plVar4 == (lys_module *)0x0) {
      ly_log((ly_ctx *)dev_p_local->nodeid,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
             ,0x8eb);
      dev._4_4_ = LY_EINT;
    }
    else if (plVar4 == (lys_module *)dev_p_local->dsc) {
      for (p__._4_4_ = 0; p__._4_4_ < *(uint *)((long)&dev_p_local[2].nodeid + 4);
          p__._4_4_ = p__._4_4_ + 1) {
        lVar3 = lys_abs_schema_nodeid_match
                          ((ly_ctx *)dev_p_local->nodeid,(lysc_nodeid *)new_dev,plStack_20,
                           (lysc_nodeid *)
                           **(undefined8 **)(dev_p_local[2].dsc + (ulong)p__._4_4_ * 8),
                           (lysp_module *)
                           **(undefined8 **)
                             (*(long *)(dev_p_local[2].dsc + (ulong)p__._4_4_ * 8) + 0x10));
        if (lVar3 != '\0') {
          nodeid = *(lysc_nodeid **)(dev_p_local[2].dsc + (ulong)p__._4_4_ * 8);
          break;
        }
      }
      if (nodeid == (lysc_nodeid *)0x0) {
        nodeid = (lysc_nodeid *)calloc(1,0x20);
        if (nodeid == (lysc_nodeid *)0x0) {
          ly_log((ly_ctx *)dev_p_local->nodeid,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_deviation");
          dev._4_4_ = LY_EMEM;
          goto LAB_0017e839;
        }
        dev._4_4_ = ly_set_add((ly_set *)(dev_p_local + 2),nodeid,'\x01',(uint32_t *)0x0);
        if (dev._4_4_ != LY_SUCCESS) goto LAB_0017e839;
        nodeid->str = (char *)new_dev;
        new_dev = (lysp_deviation **)0x0;
      }
      if (nodeid->prefix == (char **)0x0) {
        p___1 = (char *)malloc(0x10);
        if (p___1 == (char *)0x0) {
          ly_log((ly_ctx *)dev_p_local->nodeid,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_deviation");
          dev._4_4_ = LY_EMEM;
          goto LAB_0017e839;
        }
        p___1[0] = '\x01';
        p___1[1] = '\0';
        p___1[2] = '\0';
        p___1[3] = '\0';
        p___1[4] = '\0';
        p___1[5] = '\0';
        p___1[6] = '\0';
        p___1[7] = '\0';
      }
      else {
        nodeid->prefix[-1] = nodeid->prefix[-1] + 1;
        p___1 = (char *)realloc(nodeid->prefix + -1,(long)nodeid->prefix[-1] * 8 + 8);
        if (p___1 == (char *)0x0) {
          nodeid->prefix[-1] = nodeid->prefix[-1] + -1;
          ly_log((ly_ctx *)dev_p_local->nodeid,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_deviation");
          dev._4_4_ = LY_EMEM;
          goto LAB_0017e839;
        }
      }
      nodeid->prefix = (char **)(p___1 + 8);
      ppcVar1 = nodeid->prefix;
      pcVar2 = nodeid->prefix[-1];
      memset(ppcVar1 + (long)(pcVar2 + -1),0,8);
      ppcVar1[(long)(pcVar2 + -1)] = (char *)pmod_local;
      if (nodeid->name == (char **)0x0) {
        local_68 = (undefined8 *)malloc(0x10);
        if (local_68 == (undefined8 *)0x0) {
          ly_log((ly_ctx *)dev_p_local->nodeid,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_deviation");
          dev._4_4_ = LY_EMEM;
          goto LAB_0017e839;
        }
        *local_68 = 1;
      }
      else {
        nodeid->name[-1] = nodeid->name[-1] + 1;
        local_68 = (undefined8 *)realloc(nodeid->name + -1,(long)nodeid->name[-1] * 8 + 8);
        if (local_68 == (undefined8 *)0x0) {
          nodeid->name[-1] = nodeid->name[-1] + -1;
          ly_log((ly_ctx *)dev_p_local->nodeid,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_precompile_own_deviation");
          dev._4_4_ = LY_EMEM;
          goto LAB_0017e839;
        }
      }
      nodeid->name = (char **)(local_68 + 1);
      ppcVar1 = nodeid->name;
      pcVar2 = nodeid->name[-1];
      memset(ppcVar1 + (long)(pcVar2 + -1),0,8);
      ppcVar1[(long)(pcVar2 + -1)] = (char *)plStack_20;
    }
  }
LAB_0017e839:
  lysc_nodeid_free((ly_ctx *)dev_p_local->nodeid,(lysc_nodeid *)new_dev);
  return dev._4_4_;
}

Assistant:

static LY_ERR
lys_precompile_own_deviation(struct lysc_ctx *ctx, struct lysp_deviation *dev_p, const struct lysp_module *pmod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_deviation *dev = NULL;
    struct lysc_nodeid *nodeid = NULL;
    struct lysp_deviation **new_dev;
    const struct lys_module *mod;
    const struct lysp_module **new_dev_pmod;
    uint32_t i;

    /* parse its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, dev_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* deviation for another module, ignore */
        goto cleanup;
    }

    /* try to find the node in already compiled deviations */
    for (i = 0; i < ctx->devs.count; ++i) {
        if (lys_abs_schema_nodeid_match(ctx->ctx, nodeid, pmod, ((struct lysc_deviation *)ctx->devs.objs[i])->nodeid,
                ((struct lysc_deviation *)ctx->devs.objs[i])->dev_pmods[0])) {
            dev = ctx->devs.objs[i];
            break;
        }
    }

    if (!dev) {
        /* allocate new compiled deviation */
        dev = calloc(1, sizeof *dev);
        LY_CHECK_ERR_GOTO(!dev, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
        LY_CHECK_GOTO(ret = ly_set_add(&ctx->devs, dev, 1, NULL), cleanup);

        dev->nodeid = nodeid;
        nodeid = NULL;
    }

    /* add new parsed deviation structure */
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->devs, new_dev, ret, cleanup);
    *new_dev = dev_p;
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->dev_pmods, new_dev_pmod, ret, cleanup);
    *new_dev_pmod = pmod;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}